

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packets.c
# Opt level: O0

int rtr_send_pdu(rtr_socket *rtr_socket,void *pdu,uint len)

{
  tr_socket *socket;
  long lVar1;
  undefined1 *puVar2;
  ulong len_00;
  long in_FS_OFFSET;
  undefined8 uStack_60;
  undefined1 auStack_58 [4];
  int local_54;
  undefined1 *local_50;
  int local_48;
  undefined4 local_44;
  int rtval;
  unsigned_long __vla_expr0;
  uint local_2c;
  void *pvStack_28;
  uint len_local;
  void *pdu_local;
  rtr_socket *rtr_socket_local;
  long local_10;
  
  __vla_expr0 = (unsigned_long)auStack_58;
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  _rtval = (ulong)len;
  lVar1 = -(_rtval + 0xf & 0xfffffffffffffff0);
  local_50 = auStack_58 + lVar1;
  local_2c = len;
  pvStack_28 = pdu;
  pdu_local = rtr_socket;
  *(undefined8 *)((long)&uStack_60 + lVar1) = 0x10e294;
  memcpy(auStack_58 + lVar1,pdu,(ulong)len);
  puVar2 = local_50;
  *(undefined8 *)((long)&uStack_60 + lVar1) = 0x10e29d;
  rtr_pdu_to_network_byte_order(puVar2);
  puVar2 = local_50;
  if (*(int *)((long)pdu_local + 0x24) == 9) {
    rtr_socket_local._4_4_ = -1;
  }
  else {
    socket = *pdu_local;
    len_00 = (ulong)local_2c;
    *(undefined8 *)((long)&uStack_60 + lVar1) = 0x10e2d1;
    local_48 = tr_send_all(socket,puVar2,len_00,0x3c);
    if (local_48 < 1) {
      if (local_48 == -2) {
        *(undefined8 *)((long)&uStack_60 + lVar1) = 0x10e2fe;
        lrtr_dbg("RTR Socket: send would block");
        rtr_socket_local._4_4_ = -1;
      }
      else {
        *(undefined8 *)((long)&uStack_60 + lVar1) = 0x10e31c;
        lrtr_dbg("RTR Socket: Error sending PDU");
        rtr_socket_local._4_4_ = -1;
      }
    }
    else {
      rtr_socket_local._4_4_ = 0;
    }
  }
  local_44 = 1;
  local_54 = rtr_socket_local._4_4_;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return rtr_socket_local._4_4_;
  }
  *(undefined8 *)(__vla_expr0 - 8) = 0x10e356;
  __stack_chk_fail();
}

Assistant:

static int rtr_send_pdu(const struct rtr_socket *rtr_socket, const void *pdu, const unsigned int len)
{
	char pdu_converted[len];

	memcpy(pdu_converted, pdu, len);
	rtr_pdu_to_network_byte_order(pdu_converted);
	if (rtr_socket->state == RTR_SHUTDOWN)
		return RTR_ERROR;
	const int rtval = tr_send_all(rtr_socket->tr_socket, pdu_converted, len, RTR_SEND_TIMEOUT);

	if (rtval > 0)
		return RTR_SUCCESS;
	if (rtval == TR_WOULDBLOCK) {
		RTR_DBG1("send would block");
		return RTR_ERROR;
	}

	RTR_DBG1("Error sending PDU");
	return RTR_ERROR;
}